

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O1

big_integer *
anon_unknown.dwarf_cd9f::extract_random_element<big_integer>
          (big_integer *__return_storage_ptr__,vector<big_integer,_std::allocator<big_integer>_> *v)

{
  pointer pbVar1;
  pointer pbVar2;
  pointer puVar3;
  int iVar4;
  ulong uVar5;
  pointer local_50;
  pointer local_48;
  pointer local_40;
  int8_t local_38;
  
  iVar4 = rand();
  pbVar1 = (v->super__Vector_base<big_integer,_std::allocator<big_integer>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (ulong)(long)iVar4 %
          (ulong)((long)(v->super__Vector_base<big_integer,_std::allocator<big_integer>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&__return_storage_ptr__->digits,&pbVar1[uVar5].digits);
  __return_storage_ptr__->sign = pbVar1[uVar5].sign;
  pbVar1 = (v->super__Vector_base<big_integer,_std::allocator<big_integer>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pbVar2 = (v->super__Vector_base<big_integer,_std::allocator<big_integer>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_50 = pbVar2[-1].digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_48 = pbVar2[-1].digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  local_40 = pbVar2[-1].digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  pbVar2[-1].digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pbVar2[-1].digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar2[-1].digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = pbVar2[-1].sign;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&pbVar2[-1].digits,pbVar1 + uVar5);
  pbVar2[-1].sign = pbVar1[uVar5].sign;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&pbVar1[uVar5].digits,&local_50);
  pbVar1[uVar5].sign = local_38;
  if (local_50 != (pointer)0x0) {
    operator_delete(local_50,(long)local_40 - (long)local_50);
  }
  pbVar1 = (v->super__Vector_base<big_integer,_std::allocator<big_integer>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  (v->super__Vector_base<big_integer,_std::allocator<big_integer>_>)._M_impl.super__Vector_impl_data
  ._M_finish = pbVar1 + -1;
  puVar3 = pbVar1[-1].digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3,(long)pbVar1[-1].digits.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

T extract_random_element(std::vector<T> &v) {
        size_t index = rand() % v.size();
        T copy = v[index];
        erase_unordered(v, v.begin() + index);
        return copy;
    }